

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::ExpandDimsLayerParams::_InternalSerialize
          (ExpandDimsLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  void *data;
  bool bVar2;
  LogMessage *other;
  ulong uVar3;
  ulong uVar4;
  int size;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong *puVar8;
  size_t __n;
  byte *pbVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar7 = (this->_axes_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar7) {
    pbVar9 = stream->end_;
    if (pbVar9 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar9 = stream->end_;
    }
    if (pbVar9 <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *target = 10;
    pbVar9 = target + 1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar9;
        *target = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar9 = target + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
    }
    target = target + 2;
    *pbVar9 = (byte)uVar7;
    puVar8 = (ulong *)(this->axes_).arena_or_elements_;
    puVar1 = puVar8 + (this->axes_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar4 = *puVar8;
      *target = (byte)uVar4;
      if (uVar4 < 0x80) {
        pbVar9 = target + 1;
      }
      else {
        *target = (byte)uVar4 | 0x80;
        target[1] = (byte)(uVar4 >> 7);
        pbVar9 = target + 2;
        if (0x3fff < uVar4) {
          uVar5 = (ulong)target[1];
          uVar4 = uVar4 >> 7;
          do {
            pbVar9[-1] = (byte)uVar5 | 0x80;
            uVar3 = uVar4 >> 7;
            *pbVar9 = (byte)uVar3;
            pbVar9 = pbVar9 + 1;
            uVar5 = uVar3 & 0xffffffff;
            bVar2 = 0x3fff < uVar4;
            uVar4 = uVar3;
          } while (bVar2);
        }
      }
      target = pbVar9;
      puVar8 = puVar8 + 1;
    } while (puVar8 < puVar1);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
    }
    else {
      memcpy(target,data,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* ExpandDimsLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ExpandDimsLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 axes = 1;
  {
    int byte_size = _axes_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          1, _internal_axes(), byte_size, target);
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ExpandDimsLayerParams)
  return target;
}